

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * nameFilterForMime(QString *mimeType)

{
  ulong uVar1;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
  *in_RDI;
  long in_FS_OFFSET;
  QString patterns;
  QMimeType mime;
  QMimeDatabase db;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
  *b;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
  *pQVar2;
  QChar sep;
  QChar local_82 [13];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48[0] = &DAT_aaaaaaaaaaaaaaaa;
  b = in_RDI;
  pQVar2 = in_RDI;
  QMimeDatabase::QMimeDatabase((QMimeDatabase *)local_48);
  sep.ucs = (char16_t)((ulong)pQVar2 >> 0x30);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::mimeTypeForName((QString *)&local_50);
  uVar1 = QMimeType::isValid();
  if ((uVar1 & 1) == 0) {
    QString::QString((QString *)0x757b5b);
  }
  else {
    uVar1 = QMimeType::isDefault();
    if ((uVar1 & 1) == 0) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QMimeType::globPatterns();
      QChar::QChar<char16_t,_true>(local_82,L' ');
      QListSpecialMethods<QString>::join
                ((QListSpecialMethods<QString> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),sep);
      QList<QString>::~QList((QList<QString> *)0x757a80);
      QMimeType::comment();
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(size_t)b);
      operator+((QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                (QLatin1String *)b);
      operator+((QStringBuilder<QString,_QLatin1String> *)
                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(QString *)b);
      operator+((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> *)
                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(char16_t *)b);
      QStringBuilder::operator_cast_to_QString(in_RDI);
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
                         *)0x757b1a);
      QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> *)0x757b27
                );
      QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                ((QStringBuilder<QString,_QLatin1String> *)0x757b31);
      QString::~QString((QString *)0x757b3b);
      QString::~QString((QString *)0x757b50);
    }
    else {
      QFileDialog::tr((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (char *)b,(int)((ulong)in_RDI >> 0x20));
    }
  }
  QMimeType::~QMimeType((QMimeType *)&local_50);
  QMimeDatabase::~QMimeDatabase((QMimeDatabase *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)b;
  }
  __stack_chk_fail();
}

Assistant:

static QString nameFilterForMime(const QString &mimeType)
{
    QMimeDatabase db;
    QMimeType mime(db.mimeTypeForName(mimeType));
    if (mime.isValid()) {
        if (mime.isDefault()) {
            return QFileDialog::tr("All files (*)");
        } else {
            const QString patterns = mime.globPatterns().join(u' ');
            return mime.comment() + " ("_L1 + patterns + u')';
        }
    }
    return QString();
}